

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status
json_object_dotset_string_with_len(JSON_Object *object,char *name,char *string,size_t len)

{
  JSON_Status JVar1;
  JSON_Value *value_00;
  char *in_RCX;
  JSON_Value *value;
  size_t in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  value_00 = json_value_init_string_with_len(in_RCX,in_stack_ffffffffffffffd0);
  if (value_00 == (JSON_Value *)0x0) {
    local_4 = -1;
  }
  else {
    JVar1 = json_object_dotset_value((JSON_Object *)string,(char *)len,value);
    if (JVar1 == 0) {
      local_4 = 0;
    }
    else {
      json_value_free(value_00);
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

JSON_Status json_object_dotset_string_with_len(JSON_Object *object, const char *name, const char *string, size_t len) {
    JSON_Value *value = json_value_init_string_with_len(string, len);
    if (value == NULL) {
        return JSONFailure;
    }
    if (json_object_dotset_value(object, name, value) != JSONSuccess) {
        json_value_free(value);
        return JSONFailure;
    }
    return JSONSuccess;
}